

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O3

int __thiscall ArgParser::ArgIterator::option(ArgIterator *this)

{
  char *pcVar1;
  int iVar2;
  range_error *this_00;
  
  if (this->i != this->argc) {
    pcVar1 = this->p;
    if (*pcVar1 == '-') {
      this->isoption = pcVar1[1] != '\0';
      iVar2 = (int)pcVar1[1];
    }
    else {
      this->isoption = false;
      iVar2 = -1;
    }
    return iVar2;
  }
  this_00 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this_00,"arg out of range");
  __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

int option()
        {
            if (i==argc)
                throw std::range_error("arg out of range");
            if (*p=='-') {
                // a single '-' by itself is not considered an option,
                // so 'getstr()' will return "-"
                isoption = p[1]!=0;
                return p[1];
            }
            isoption = false;
            return -1;
        }